

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O1

int KINSetInfoHandlerFn(void *kinmem,KINInfoHandlerFn ihfun,void *ih_data)

{
  int iVar1;
  
  if (kinmem == (void *)0x0) {
    iVar1 = -1;
    KINProcessError((KINMem)0x0,-1,"KINSOL","KINSetInfoHandlerFn","kinsol_mem = NULL illegal.");
  }
  else {
    *(KINInfoHandlerFn *)((long)kinmem + 0x268) = ihfun;
    *(void **)((long)kinmem + 0x270) = ih_data;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int KINSetInfoHandlerFn(void *kinmem, KINInfoHandlerFn ihfun, void *ih_data)
{
  KINMem kin_mem;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINSetInfoHandlerFn", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;

  kin_mem->kin_ihfun = ihfun;
  kin_mem->kin_ih_data = ih_data;

  return(KIN_SUCCESS);
}